

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool __thiscall Memory::Recycler::DoQueueTrackedObject(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined8 *in_FS_OFFSET;
  
  bVar4 = this->queueTrackedObject;
  if (((bool)bVar4 == false) && ((~(this->collectionState).value & 0x2001) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f2,"(this->queueTrackedObject || !this->IsConcurrentMarkState())",
                       "this->queueTrackedObject || !this->IsConcurrentMarkState()");
    if (!bVar3) goto LAB_0026a4b0;
    *puVar1 = 0;
    bVar4 = this->queueTrackedObject;
  }
  if (((bVar4 & 1) == 0) && (this->isProcessingTrackedObjects == false)) {
    bVar3 = HasPendingTrackObjects(this);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x8f3,
                         "(this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects())"
                         ,
                         "this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects()"
                        );
      if (!bVar3) goto LAB_0026a4b0;
      *puVar1 = 0;
    }
  }
  bVar4 = this->queueTrackedObject;
  if ((((bool)bVar4 == false) && (this->inPartialCollectMode == false)) &&
     ((this->collectionState).value == CollectionStateParallelMark)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f5,
                       "(this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark))"
                       ,
                       "this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark)"
                      );
    if (!bVar3) goto LAB_0026a4b0;
    *puVar1 = 0;
    bVar4 = this->queueTrackedObject;
  }
  if ((bVar4 & 1) == 0) {
    bVar4 = 0;
  }
  else if (((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
            (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next !=
            &this->clientTrackedObjectList) || (bVar4 = 1, this->inPartialCollectMode == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f6,
                       "(!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode))"
                       ,
                       "!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode)"
                      );
    if (!bVar3) {
LAB_0026a4b0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    bVar4 = this->queueTrackedObject;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool
Recycler::DoQueueTrackedObject() const
{
    Assert(this->queueTrackedObject || !this->IsConcurrentMarkState());
    Assert(this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects());
#if ENABLE_PARTIAL_GC
    Assert(this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark));
    Assert(!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode));
#else
    Assert(this->queueTrackedObject || !(this->collectionState == CollectionStateParallelMark));
#endif
    return this->queueTrackedObject;
}